

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

GdlExpression * __thiscall
GdlBinaryExpression::SimplifyAndUnscale
          (GdlBinaryExpression *this,GrcGlyphAttrMatrix *pgax,gid16 wGlyphID,SymbolSet *setpsym,
          GrcFont *pfont,bool fGAttrDefChk,bool *pfCanSub)

{
  int iVar1;
  undefined4 extraout_var;
  GdlExpression *pGVar3;
  GdlBinaryExpression *pGVar4;
  undefined6 in_register_00000012;
  undefined7 in_register_00000089;
  bool fCanSubOperand2;
  bool fCanSubOperand1;
  int nValue;
  char local_36;
  char local_35;
  undefined4 local_34;
  GdlExpression *pGVar2;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->m_pexpOperand1->_vptr_GdlExpression[0xf])();
  pGVar2 = (GdlExpression *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->m_pexpOperand2->_vptr_GdlExpression[0xf])
                    (this->m_pexpOperand2,pgax,CONCAT62(in_register_00000012,wGlyphID) & 0xffffffff,
                     setpsym,pfont,CONCAT71(in_register_00000089,fGAttrDefChk) & 0xffffffff,
                     &local_36);
  pGVar3 = (GdlExpression *)CONCAT44(extraout_var_00,iVar1);
  pGVar4 = (GdlBinaryExpression *)0x0;
  if ((pGVar2 != (GdlExpression *)0x0) && (pGVar3 != (GdlExpression *)0x0)) {
    pGVar4 = this;
    if (pGVar2 != this->m_pexpOperand1) {
      if (local_35 == '\0') {
        iVar1 = (**(this->super_GdlExpression)._vptr_GdlExpression)(this);
        pGVar4 = (GdlBinaryExpression *)__dynamic_cast(iVar1,&GdlExpression::typeinfo,&typeinfo,0);
      }
      if (pGVar4->m_pexpOperand1 != (GdlExpression *)0x0) {
        (*pGVar4->m_pexpOperand1->_vptr_GdlExpression[2])();
      }
      pGVar4->m_pexpOperand1 = pGVar2;
    }
    if (pGVar3 != this->m_pexpOperand2) {
      if ((pGVar4 == this) && (local_36 == '\0')) {
        iVar1 = (**(this->super_GdlExpression)._vptr_GdlExpression)(this);
        pGVar4 = (GdlBinaryExpression *)__dynamic_cast(iVar1,&GdlExpression::typeinfo,&typeinfo,0);
      }
      if (pGVar4->m_pexpOperand2 != (GdlExpression *)0x0) {
        (*pGVar4->m_pexpOperand2->_vptr_GdlExpression[2])();
      }
      pGVar4->m_pexpOperand2 = pGVar3;
    }
    *pfCanSub = pGVar4 == this;
    iVar1 = (*(this->super_GdlExpression)._vptr_GdlExpression[7])(this,&local_34,0);
    if ((char)iVar1 != '\0') {
      pGVar4 = (GdlBinaryExpression *)operator_new(0x40);
      GdlObject::GdlObject(&(pGVar4->super_GdlExpression).super_GdlObject);
      (pGVar4->super_GdlExpression)._vptr_GdlExpression = (_func_int **)&PTR_Clone_00241fc8;
      *(undefined4 *)&(pGVar4->super_GdlExpression).field_0x34 = local_34;
      *(undefined4 *)&pGVar4->m_psymOperator = 0xffffffff;
      *(undefined1 *)((long)&pGVar4->m_psymOperator + 4) = 0;
      (pGVar4->super_GdlExpression).m_exptResult = kexptNumber;
      iVar1 = (this->super_GdlExpression).super_GdlObject.m_lnf.m_nLineOrig;
      (pGVar4->super_GdlExpression).super_GdlObject.m_lnf.m_nLinePre =
           (this->super_GdlExpression).super_GdlObject.m_lnf.m_nLinePre;
      (pGVar4->super_GdlExpression).super_GdlObject.m_lnf.m_nLineOrig = iVar1;
      std::__cxx11::string::_M_assign
                ((string *)&(pGVar4->super_GdlExpression).super_GdlObject.m_lnf.m_staFile);
    }
  }
  return &pGVar4->super_GdlExpression;
}

Assistant:

GdlExpression * GdlBinaryExpression::SimplifyAndUnscale(GrcGlyphAttrMatrix * pgax,
	gid16 wGlyphID, SymbolSet & setpsym, GrcFont * pfont, bool fGAttrDefChk,
	bool * pfCanSub)
{
	bool fCanSubOperand1, fCanSubOperand2;
	GdlExpression * pexpOperand1New =
		m_pexpOperand1->SimplifyAndUnscale(pgax, wGlyphID, setpsym, pfont,
			fGAttrDefChk, &fCanSubOperand1);
	GdlExpression * pexpOperand2New =
		m_pexpOperand2->SimplifyAndUnscale(pgax, wGlyphID, setpsym, pfont,
			fGAttrDefChk, &fCanSubOperand2);

	if (!pexpOperand1New || !pexpOperand2New)
		return NULL;

	GdlBinaryExpression * pexpbinRet = this;

	if (pexpOperand1New && pexpOperand1New != m_pexpOperand1)
	{
		if (!fCanSubOperand1)
		{
			pexpbinRet = dynamic_cast<GdlBinaryExpression *>(this->Clone());
			Assert(pexpbinRet);
		}
		delete pexpbinRet->m_pexpOperand1;
		pexpbinRet->m_pexpOperand1 = pexpOperand1New;
	}
	if (pexpOperand2New && pexpOperand2New != m_pexpOperand2)
	{
		if (!fCanSubOperand2 && pexpbinRet == this)
		{
			pexpbinRet = dynamic_cast<GdlBinaryExpression *>(this->Clone());
			Assert(pexpbinRet);
		}
		delete pexpbinRet->m_pexpOperand2;
		pexpbinRet->m_pexpOperand2 = pexpOperand2New;
	}
	*pfCanSub = (pexpbinRet == this);

	int nValue;
	if (this->ResolveToInteger(&nValue, false))
	{
		GdlExpression * pexpRet = new GdlNumericExpression(nValue);
		pexpRet->CopyLineAndFile(*this);
		return pexpRet;
	}

	return pexpbinRet;
}